

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O2

void __thiscall
wasm::TypeMapper::modifyContinuation(TypeMapper *this,HeapType oldType,Continuation *continuation)

{
  HeapType HVar1;
  HeapType local_20;
  HeapType oldType_local;
  
  local_20.id = oldType.id;
  HVar1.id = (uintptr_t)HeapType::getContinuation(&local_20);
  HVar1 = getNewHeapType(this,HVar1);
  (continuation->type).id = HVar1.id;
  return;
}

Assistant:

void modifyContinuation(HeapType oldType,
                          Continuation& continuation) override {
    continuation.type = getNewHeapType(oldType.getContinuation().type);
  }